

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLinfo.c
# Opt level: O2

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < uInfo->nofWeights; uVar1 = uVar1 + 1) {
    free(*uInfo->URFrel[uVar1]);
    free(uInfo->URFrel[uVar1]);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  for (uVar1 = 0; uVar1 < uInfo->nofURFs; uVar1 = uVar1 + 1) {
    free(uInfo->URFs[uVar1]);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
  return;
}

Assistant:

void RDL_deleteURFInfo(RDL_URFinfo *uInfo)
{
  unsigned i;
  for(i=0; i<uInfo->nofWeights; ++i)
  {
    free(uInfo->URFrel[i][0]);
    free(uInfo->URFrel[i]);
  }
  free(uInfo->URFrel);
  free(uInfo->nofProtos);
  for(i=0; i<uInfo->nofURFs; ++i)
  {
    free(uInfo->URFs[i]);
  }
  free(uInfo->URFs);
  free(uInfo->nofCFsPerURF);
  free(uInfo);
}